

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::Duration::_InternalParse(Duration *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  void *pvVar1;
  bool bVar2;
  uint64 uVar3;
  UnknownFieldSet *unknown;
  ulong tag_00;
  uint local_3c;
  char *pcStack_38;
  uint32 tag;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pcStack_38 = ptr;
  do {
    while( true ) {
      bVar2 = internal::ParseContext::Done(ctx,&stack0xffffffffffffffc8);
      if (bVar2) {
        return pcStack_38;
      }
      pcStack_38 = internal::ReadTag(pcStack_38,&local_3c,0);
      if (pcStack_38 == (char *)0x0) {
        return (char *)0x0;
      }
      tag_00 = (ulong)local_3c;
      if (local_3c >> 3 == 2) break;
      if ((local_3c >> 3 != 1) || ((char)local_3c != '\b')) goto LAB_002e41ab;
      uVar3 = internal::ReadVarint64(&stack0xffffffffffffffc8);
      this->seconds_ = uVar3;
LAB_002e41a2:
      if (pcStack_38 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    if ((char)local_3c == '\x10') {
      uVar3 = internal::ReadVarint64(&stack0xffffffffffffffc8);
      this->nanos_ = (int32)uVar3;
      goto LAB_002e41a2;
    }
LAB_002e41ab:
    if ((tag_00 == 0) || ((local_3c & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      return pcStack_38;
    }
    pvVar1 = this_00->ptr_;
    if (((ulong)pvVar1 & 1) == 0) {
      unknown = internal::InternalMetadata::
                mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      unknown = (UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8);
    }
    pcStack_38 = internal::UnknownFieldParse(tag_00,unknown,pcStack_38,ctx);
    if (pcStack_38 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Duration::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // int64 seconds = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          seconds_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // int32 nanos = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          nanos_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}